

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::RequiredTagMissing::RequiredTagMissing(RequiredTagMissing *this,int f,string *what)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *what_local;
  RequiredTagMissing *pRStack_10;
  int f_local;
  RequiredTagMissing *this_local;
  
  local_20 = what;
  what_local._4_4_ = f;
  pRStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Required tag missing",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&this->super_Exception = &PTR__RequiredTagMissing_0030b7f0;
  this->field = what_local._4_4_;
  return;
}

Assistant:

RequiredTagMissing( int f = 0, const std::string& what = "" )
    : Exception( "Required tag missing", what ),
                 field( f ) {}